

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::Arena::FreeBlocks(Arena *this)

{
  Block *pBVar1;
  undefined8 *puVar2;
  Block *pBVar3;
  uint64 uVar4;
  Block *b;
  
  uVar4 = 0;
  pBVar1 = *(Block **)(this + 8);
  pBVar3 = (Block *)0x0;
  while (b = pBVar3, pBVar3 = pBVar1, pBVar3 != (Block *)0x0) {
    pBVar1 = pBVar3->next;
    uVar4 = uVar4 + pBVar3->size;
    if ((pBVar1 != (Block *)0x0) || (this[0x28] == (Arena)0x1)) {
      (**(code **)(this + 0x68))();
      pBVar3 = b;
    }
  }
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  if (this[0x28] == (Arena)0x0) {
    b->pos = 0x20;
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_007753e8);
    b->owner = puVar2;
    puVar2[1] = b;
    *puVar2 = *(undefined8 *)this;
    AddBlockInternal(this,b);
  }
  return uVar4;
}

Assistant:

uint64 Arena::FreeBlocks() {
  uint64 space_allocated = 0;
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  Block* first_block = NULL;
  while (b != NULL) {
    space_allocated += (b->size);
    Block* next = b->next;
    if (next != NULL) {
#ifdef ADDRESS_SANITIZER
      // This memory was provided by the underlying allocator as unpoisoned, so
      // return it in an unpoisoned state.
      ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
      options_.block_dealloc(b, b->size);
    } else {
      if (owns_first_block_) {
#ifdef ADDRESS_SANITIZER
        // This memory was provided by the underlying allocator as unpoisoned,
        // so return it in an unpoisoned state.
        ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
        options_.block_dealloc(b, b->size);
      } else {
        // User passed in the first block, skip free'ing the memory.
        first_block = b;
      }
    }
    b = next;
  }
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  if (!owns_first_block_) {
    // Make the first block that was passed in through ArenaOptions
    // available for reuse.
    first_block->pos = kHeaderSize;
    // Thread which calls Reset() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
  }
  return space_allocated;
}